

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_PrecacheSounds(FMapInfoParser *parse,level_info_t *info)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  do {
    FScanner::MustGetString(&parse->sc);
    iVar3 = S_FindSound((parse->sc).String);
    if (iVar3 == 0) {
      FScanner::ScriptMessage(&parse->sc,"Unknown sound \"%s\"",(parse->sc).String);
    }
    else {
      TArray<FSoundID,_FSoundID>::Grow(&info->PrecacheSounds,1);
      uVar1 = (info->PrecacheSounds).Count;
      (info->PrecacheSounds).Array[uVar1].ID = iVar3;
      (info->PrecacheSounds).Count = uVar1 + 1;
    }
    bVar2 = FScanner::CheckString(&parse->sc,",");
  } while (bVar2);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheSounds, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		FSoundID snd = parse.sc.String;
		if (snd == 0)
		{
			parse.sc.ScriptMessage("Unknown sound \"%s\"", parse.sc.String);
		}
		else
		{
			info->PrecacheSounds.Push(snd);
		}
	} while (parse.sc.CheckString(","));
}